

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::
HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++:1043:34),_kj::_::PropagateException>_>
::disposeImpl(HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_test_util_c__:1043:34),_kj::_::PropagateException>_>
              *this,void *pointer)

{
  long *plVar1;
  
  if (pointer != (void *)0x0) {
    TransformPromiseNodeBase::dropDependency((TransformPromiseNodeBase *)pointer);
    plVar1 = *(long **)((long)pointer + 0x30);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x30) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x28))
                (*(undefined8 **)((long)pointer + 0x28),(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    *(undefined ***)pointer = &PTR_onReady_0037d7d0;
    plVar1 = *(long **)((long)pointer + 0x10);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x10) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 8))
                (*(undefined8 **)((long)pointer + 8),(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
  }
  operator_delete(pointer,0x48);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }